

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

void __thiscall
expr_tree::expr_tree
          (expr_tree *this,expr_node *_root,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *_parameters,string *_variable,string *_name)

{
  string *in_RCX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RSI;
  undefined8 *in_RDI;
  string *in_R8;
  
  *in_RDI = in_RSI;
  tld::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  vector(in_RSI,in_RDX);
  std::__cxx11::string::string((string *)(in_RDI + 5),in_RCX);
  std::__cxx11::string::string((string *)(in_RDI + 9),in_R8);
  *(undefined4 *)(in_RDI + 0xd) = 0;
  return;
}

Assistant:

expr_tree::expr_tree(expr_node* _root, const tld::vector<std::string>& _parameters, const std::string& _variable, const std::string& _name) :
    root_(_root),
    parameters_(_parameters),
    variable_(_variable),
    name_(_name),
    errno_(T_OK)
{}